

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logmq.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  __pid_t _Var1;
  uint uVar2;
  int iVar3;
  LogMQ *this;
  int status;
  int ret;
  pid_t pid;
  int local_54;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38 [8];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  _Var1 = fork();
  if (_Var1 == 0) {
    uVar2 = system("../logmq/logmq");
    exit((int)(uVar2 & 0xff00) >> 8);
  }
  if (_Var1 < 0) {
    abort();
  }
  sleep(2);
  this = (LogMQ *)operator_new(0x30);
  local_4d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  liblogger::LogMQ::LogMQ(this,local_38);
  local_4d = 0;
  liblogger::LogManager::Add((ILogger *)this);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  examples();
  liblogger::LogManager::RemoveAll();
  iVar3 = kill(_Var1,0xf);
  if (iVar3 < 0) {
    abort();
  }
  local_54 = 0;
  _Var1 = waitpid(_Var1,&local_54,0);
  if (_Var1 < 0) {
    abort();
  }
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	pid_t pid = fork();
	if (pid == 0) {
		int ret = system("../logmq/logmq");
		exit(WEXITSTATUS(ret));
	}
	if (pid < 0)
		abort();

	sleep(2); //Poor workaround for race if we start before the child

	LogManager::Add(new LogMQ());

	examples();

	LogManager::RemoveAll();

	if (kill(pid, SIGTERM) < 0)
		abort();

	int status = 0;
	if (waitpid(pid, &status, 0) < 0)
		abort();

	return 0;
}